

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O2

void __thiscall cmFileLockPool::PopFileScope(cmFileLockPool *this)

{
  _List_node_base *this_00;
  
  if ((this->FileScopes).
      super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->FileScopes) {
    this_00 = (this->FileScopes).
              super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
              ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
    if (this_00 != (_List_node_base *)0x0) {
      ScopePool::~ScopePool((ScopePool *)this_00);
    }
    operator_delete(this_00,0x18);
    std::__cxx11::list<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::
    pop_back(&this->FileScopes);
    return;
  }
  __assert_fail("!this->FileScopes.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmFileLockPool.cxx"
                ,0x32,"void cmFileLockPool::PopFileScope()");
}

Assistant:

void cmFileLockPool::PopFileScope()
{
  assert(!this->FileScopes.empty());
  delete this->FileScopes.back();
  this->FileScopes.pop_back();
}